

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.hpp
# Opt level: O0

uri * __thiscall
jsoncons::jsonschema::
compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
get_base_uri(compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *this)

{
  uri_wrapper *in_RSI;
  uri *in_RDI;
  uri *in_stack_ffffffffffffffd8;
  uri *this_00;
  
  this_00 = in_RDI;
  uri_wrapper::uri(in_RSI);
  jsoncons::uri::uri(this_00,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

uri get_base_uri() const
        {
            return base_uri_.uri();
        }